

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

void do_ltrack(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  BUFFER *buffer;
  MYSQL *pMVar5;
  long lVar6;
  undefined8 *puVar7;
  char *pcVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  char *pcVar9;
  uint uVar10;
  string_view fmt;
  format_args args;
  string query;
  char *local_3688 [2];
  char *local_3678;
  char *local_3668;
  char *local_3658;
  char *local_3648;
  char arg2 [4608];
  char buf [4608];
  char arg1 [4608];
  
  pcVar4 = one_argument(argument,arg1);
  pcVar4 = one_argument(pcVar4,arg2);
  if (arg1[0] == '\0') {
    send_to_char("Syntax: ltrack <name, date, site> <all/new/in/out?> <#display?>\n\r",ch);
  }
  else {
    iVar2 = -1;
    if (arg2[0] == '\0') {
      uVar10 = 0xffffffff;
    }
    else {
      bVar1 = str_cmp(arg2,"new");
      uVar10 = 0;
      if (bVar1) {
        bVar1 = str_cmp(arg2,"in");
        if (bVar1) {
          bVar1 = str_cmp(arg2,"out");
          uVar10 = -(uint)bVar1 | 2;
        }
        else {
          uVar10 = 1;
        }
      }
      if ((*pcVar4 != '\0') && (bVar1 = is_number(pcVar4), bVar1)) {
        iVar2 = atoi(pcVar4);
      }
    }
    buffer = new_buf();
    pcVar4 = buf;
    sprintf(pcVar4,"%d",(ulong)uVar10);
    local_3658 = "AND type=";
    if ((int)uVar10 < 0) {
      local_3658 = "";
      pcVar4 = "";
    }
    fmt.size_ = 0xccccc;
    fmt.data_ = (char *)0x6b;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_3688;
    local_3688[0] = arg1;
    local_3678 = arg1;
    local_3668 = arg1;
    local_3648 = pcVar4;
    ::fmt::v9::vformat_abi_cxx11_
              (&query,(v9 *)
                      "SELECT * FROM logins WHERE (name RLIKE \'{}\' OR site RLIKE \'{}\' OR time RLIKE \'{}\') {}{} ORDER BY ctime DESC"
               ,fmt,args);
    pMVar5 = open_conn();
    mysql_query(pMVar5,query._M_dataplus._M_p);
    lVar6 = mysql_store_result(pMVar5);
    if (lVar6 == 0) {
      iVar2 = mysql_field_count(pMVar5);
      if (iVar2 != 0) {
        send_to_char("Error accessing results.\n\r",ch);
      }
      send_to_char("No matching results were found.\n\r",ch);
    }
    else {
      for (uVar10 = 0;
          (puVar7 = (undefined8 *)mysql_fetch_row(lVar6), puVar7 != (undefined8 *)0x0 &&
          (((iVar2 == -1 || ((int)uVar10 < iVar2)) && (uVar10 < 300)))); uVar10 = uVar10 + 1) {
        strcpy(buf,(char *)puVar7[7]);
        iVar3 = atoi(buf);
        pcVar9 = "new";
        pcVar8 = "";
        pcVar4 = "";
        if (iVar3 != 0) {
          if (iVar3 == 2) {
            pcVar4 = (char *)puVar7[4];
            pcVar9 = "out";
            pcVar8 = " played, ";
          }
          else {
            if (iVar3 == 1) {
              pcVar9 = "in";
            }
            else {
              pcVar9 = "?";
            }
            pcVar8 = "";
            pcVar4 = "";
          }
        }
        sprintf(buf,"%s: %s@%s logged %s. [%s%s%s (%s) obj]\n\r",puVar7[2],*puVar7,puVar7[1],pcVar9,
                pcVar4,pcVar8,*(undefined4 *)(puVar7 + 5),*(undefined4 *)(puVar7 + 6));
        add_buf(buffer,buf);
      }
      mysql_free_result(lVar6);
      pcVar4 = buf_string(buffer);
      page_to_char(pcVar4,ch);
      free_buf(buffer);
    }
    mysql_close(pMVar5);
    std::__cxx11::string::~string((string *)&query);
  }
  return;
}

Assistant:

void do_ltrack(CHAR_DATA *ch, char *argument)
{
	MYSQL *conn;
	MYSQL_ROW row;
	MYSQL_RES *res_set;
	BUFFER *buffer;
	char arg1[MSL], arg2[MSL], buf[MSL];
	int type = -1, show = -1, i = 0;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: ltrack <name, date, site> <all/new/in/out?> <#display?>\n\r", ch);
		return;
	}

	if (arg2[0] != '\0')
	{
		if (!str_cmp(arg2, "new"))
		{
			type = 0;
		}
		else if (!str_cmp(arg2, "in"))
		{
			type = 1;
		}
		else if (!str_cmp(arg2, "out"))
		{
			type = 2;
		}

		if (argument[0] != '\0' && is_number(argument))
		{
			show = atoi(argument);
		}
	}

	buffer = new_buf();
	sprintf(buf, "%d", type);
	auto query = fmt::format("SELECT * FROM logins WHERE (name RLIKE '{}' OR site RLIKE '{}' OR time RLIKE '{}') {}{} ORDER BY ctime DESC",
		arg1,
		arg1,
		arg1,
		type > -1 ? "AND type=" : "",
		type > -1 ? buf : "");

	conn = open_conn();
	mysql_query(conn, query.c_str());
	res_set = mysql_store_result(conn);

	if (res_set == nullptr && mysql_field_count(conn) > 0)
	{
		send_to_char("Error accessing results.\n\r", ch);
	}
	else if (res_set)
	{
		while ((row = mysql_fetch_row(res_set)) != nullptr)
		{
			i++;

			if ((show != -1 && i > show) || i > 300)
				break;

			sprintf(buf, "%s", row[7]);
			type = atoi(buf);

			sprintf(buf, "%s: %s@%s logged %s. [%s%s%s (%s) obj]\n\r",
				row[2],
				row[0],
				row[1],
				type == 0 ? "new" : type == 1 ? "in" : type == 2 ? "out" : "?",
				type == 2 ? row[4] : "",
				type == 2 ? " played, " : "",
				row[5],
				row[6]);
			add_buf(buffer, buf);
		}

		mysql_free_result(res_set);
		page_to_char(buf_string(buffer), ch);
		free_buf(buffer);
		mysql_close(conn);
		return;
	}

	send_to_char("No matching results were found.\n\r", ch);
	mysql_close(conn);
	return;
}